

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

Expression * __thiscall
wasm::OptimizeInstructions::optimizeBoolean(OptimizeInstructions *this,Expression *boolean)

{
  Id IVar1;
  uintptr_t uVar2;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> pBVar3;
  bool bVar4;
  BinaryOp BVar5;
  Index bits;
  Expression *pEVar6;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> unaff_R12;
  matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> pBVar7;
  OptimizeInstructions *pOVar8;
  bool bVar9;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_140;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_118;
  anon_union_16_6_1532cd5a_for_Literal_0 local_108;
  undefined8 local_f8;
  int *local_e8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_c8;
  undefined8 local_b8;
  int *local_a8;
  anon_union_16_6_1532cd5a_for_Literal_0 local_88;
  long local_78;
  anon_union_16_6_1532cd5a_for_Literal_0 local_70;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_60;
  OptimizeInstructions *local_48;
  Expression *extended;
  int local_38;
  int local_34;
  int32_t leftShift;
  int32_t rightShift;
  
  IVar1 = boolean->_id;
  if (IVar1 == UnaryId) {
    if (*(int *)(boolean + 1) != 0x14) {
      return boolean;
    }
    pBVar7 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
             boolean[1].type.id;
    IVar1 = (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
    if ((IVar1 == UnaryId) && (pBVar7->op == LeUInt32)) {
      unaff_R12 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                  )pBVar7->left;
    }
    else {
      unaff_R12 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                  )0x0;
      if (IVar1 == BinaryId) {
        unaff_R12 = pBVar7;
      }
      bVar9 = true;
      if ((unaff_R12 ==
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)0x0)
         || (BVar5 = invertBinaryOp(this,unaff_R12->op), BVar5 == InvalidBinary)) goto LAB_009dc9b7;
      unaff_R12->op = BVar5;
    }
LAB_009dc83c:
    bVar9 = false;
    goto LAB_009dc9b7;
  }
  pBVar7 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)0x0;
  if (IVar1 == BinaryId) {
    pBVar7 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
             boolean;
  }
  if (pBVar7 == (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
                0x0) {
    bVar9 = true;
    if (IVar1 < SelectId) {
      if (IVar1 == BlockId) {
        if (((boolean->type).id == 2) && (uVar2 = boolean[2].type.id, uVar2 != 0)) {
          pEVar6 = optimizeBoolean(this,*(Expression **)(*(long *)(boolean + 2) + -8 + uVar2 * 8));
          uVar2 = boolean[2].type.id;
          if (uVar2 == 0) {
            __assert_fail("usedElements > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xd0,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          *(Expression **)(*(long *)(boolean + 2) + -8 + uVar2 * 8) = pEVar6;
        }
      }
      else if ((IVar1 == IfId) && ((boolean->type).id == 2)) {
        pEVar6 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
        boolean[1].type.id = (uintptr_t)pEVar6;
        pEVar6 = optimizeBoolean(this,*(Expression **)(boolean + 2));
        *(Expression **)(boolean + 2) = pEVar6;
      }
    }
    else if (IVar1 == SelectId) {
      pEVar6 = optimizeBoolean(this,*(Expression **)(boolean + 1));
      *(Expression **)(boolean + 1) = pEVar6;
      pEVar6 = optimizeBoolean(this,(Expression *)boolean[1].type.id);
      boolean[1].type.id = (uintptr_t)pEVar6;
    }
    else if ((IVar1 == TryId) && ((boolean->type).id == 2)) {
      pEVar6 = optimizeBoolean(this,*(Expression **)(boolean + 2));
      *(Expression **)(boolean + 2) = pEVar6;
      if (*(long *)(boolean + 5) != 0) {
        pBVar7 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
                 0x0;
        pBVar3 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
                 0x1;
        do {
          unaff_R12 = pBVar3;
          pEVar6 = optimizeBoolean(this,*(Expression **)(boolean[4].type.id + (long)pBVar7 * 8));
          if (*(matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)
               (boolean + 5) <= pBVar7) {
            __assert_fail("index < usedElements",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                          ,0xbc,
                          "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                         );
          }
          *(Expression **)(boolean[4].type.id + (long)pBVar7 * 8) = pEVar6;
          pBVar7 = unaff_R12;
          pBVar3 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                    )(ulong)((int)unaff_R12 + 1);
        } while (unaff_R12 <
                 *(matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                   *)(boolean + 5));
      }
    }
    goto LAB_009dc9b7;
  }
  BVar5 = pBVar7->op;
  pOVar8 = this;
  extended = (Expression *)this;
  if ((int)BVar5 < 8) {
    if (BVar5 == SubInt32) {
      pEVar6 = pBVar7->left;
      bVar9 = true;
      if (pEVar6->_id == ConstId) {
        if (*(long *)(pEVar6 + 2) != 2) {
LAB_009dcabb:
          __assert_fail("type == Type::i32",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                        ,0x120,"int32_t wasm::Literal::geti32() const");
        }
        if (*(int *)(pEVar6 + 1) == 0) {
          unaff_R12 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                       )pBVar7->right;
LAB_009dc834:
          bVar9 = false;
        }
      }
LAB_009dc838:
      if (!bVar9) goto LAB_009dc83c;
    }
    else if ((BVar5 == RemSInt32) &&
            (pOVar8 = (OptimizeInstructions *)pBVar7->right, unaff_R12 = pBVar7,
            *(char *)&(pOVar8->
                      super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                      ).super_Pass._vptr_Pass == '\x0e')) {
      pOVar8 = (OptimizeInstructions *)
               &(pOVar8->
                super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                ).super_Pass.name;
      bVar4 = Literal::isSignedMin((Literal *)pOVar8);
      bVar9 = true;
      if (!bVar4) {
        Literal::abs((Literal *)&local_88.func,(int)pOVar8);
        if (local_78 != 2) goto LAB_009dcabb;
        if (local_88.i32 == 0) {
          bVar9 = false;
        }
        else {
          bVar9 = (local_88.i32 & local_88.i32 - 1U) == 0;
        }
      }
      if (!bVar4) {
        Literal::~Literal((Literal *)&local_88.func);
      }
      if (bVar9) {
        pBVar7->op = AndInt32;
        bVar9 = Literal::isSignedMin((Literal *)pOVar8);
        if (bVar9) {
          Literal::makeSignedMax((Literal *)&local_c8.func,(Type)0x2);
          Literal::operator=((Literal *)pOVar8,(Literal *)&local_c8.func);
          this_00 = &local_c8;
        }
        else {
          Literal::abs((Literal *)&local_108.func,(int)pOVar8);
          Literal::makeOne((Literal *)&local_70.func,(Type)0x2);
          Literal::sub((Literal *)&local_c8.func,(Literal *)&local_108.func,
                       (Literal *)&local_70.func);
          Literal::operator=((Literal *)pOVar8,(Literal *)&local_c8.func);
          Literal::~Literal((Literal *)&local_c8.func);
          Literal::~Literal((Literal *)&local_70.func);
          this_00 = &local_108;
        }
        Literal::~Literal((Literal *)&this_00->func);
        bVar9 = false;
        goto LAB_009dc9b7;
      }
    }
  }
  else if (BVar5 == OrInt32) {
    pEVar6 = optimizeBoolean(this,pBVar7->left);
    pBVar7->left = pEVar6;
    pEVar6 = optimizeBoolean(this,pBVar7->right);
    pBVar7->right = pEVar6;
  }
  else if (BVar5 == NeInt32) {
    pEVar6 = pBVar7->right;
    bVar9 = true;
    if (pEVar6->_id == ConstId) {
      if (*(long *)(pEVar6 + 2) != 2) goto LAB_009dcabb;
      if (*(int *)(pEVar6 + 1) == 0) {
        unaff_R12 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>
                     )pBVar7->left;
        goto LAB_009dc834;
      }
    }
    goto LAB_009dc838;
  }
  if ((pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id == 2) {
    IVar1 = (pBVar7->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id;
    if (IVar1 == UnaryId) {
      if (pBVar7->op - GtUInt64 < 2) {
        pOVar8 = (OptimizeInstructions *)pBVar7->left;
      }
      else {
        pOVar8 = (OptimizeInstructions *)0x0;
      }
    }
    if (IVar1 != UnaryId) {
      local_a8 = &local_38;
      local_38 = 0;
      local_e8 = &local_34;
      local_34 = 0;
      local_118.binder = (matched_t<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> *)&local_48
      ;
      local_48 = (OptimizeInstructions *)0x0;
      local_140.submatchers.curr = &local_118;
      local_140.submatchers.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
            *)&local_c8;
      local_b8 = 0;
      local_c8.i64 = 0;
      local_60.curr = &local_140;
      local_140.binder =
           (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
      local_140.data = ShlInt32;
      local_60.next.curr =
           (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
            *)&local_108;
      local_f8 = 0;
      local_108.i64 = 0;
      local_70.i64 = 0;
      local_70._8_4_ = 0xb;
      if ((((IVar1 != BinaryId) || (pBVar7->op != ShrSInt32)) ||
          (bVar9 = Match::Internal::
                   Components<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
                   ::match(pBVar7,&local_60), !bVar9)) ||
         ((local_38 != local_34 || (pOVar8 = local_48, local_38 == 0)))) goto LAB_009dc992;
    }
  }
  else {
LAB_009dc992:
    pOVar8 = (OptimizeInstructions *)0x0;
  }
  bVar9 = pOVar8 == (OptimizeInstructions *)0x0;
  if (!bVar9) {
    bits = Properties::getSignExtBits((Expression *)pBVar7);
    unaff_R12 = (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_>)
                makeZeroExt((OptimizeInstructions *)extended,(Expression *)pOVar8,bits);
  }
LAB_009dc9b7:
  if (bVar9) {
    return boolean;
  }
  return (Expression *)unaff_R12;
}

Assistant:

Expression* optimizeBoolean(Expression* boolean) {
    // TODO use a general getFallthroughs
    if (auto* unary = boolean->dynCast<Unary>()) {
      if (unary) {
        if (unary->op == EqZInt32) {
          auto* unary2 = unary->value->dynCast<Unary>();
          if (unary2 && unary2->op == EqZInt32) {
            // double eqz
            return unary2->value;
          }
          if (auto* binary = unary->value->dynCast<Binary>()) {
            // !(x <=> y)   ==>   x <!=> y
            auto op = invertBinaryOp(binary->op);
            if (op != InvalidBinary) {
              binary->op = op;
              return binary;
            }
          }
        }
      }
    } else if (auto* binary = boolean->dynCast<Binary>()) {
      if (binary->op == SubInt32) {
        if (auto* c = binary->left->dynCast<Const>()) {
          if (c->value.geti32() == 0) {
            // bool(0 - x)   ==>   bool(x)
            return binary->right;
          }
        }
      } else if (binary->op == OrInt32) {
        // an or flowing into a boolean context can consider each input as
        // boolean
        binary->left = optimizeBoolean(binary->left);
        binary->right = optimizeBoolean(binary->right);
      } else if (binary->op == NeInt32) {
        if (auto* c = binary->right->dynCast<Const>()) {
          // x != 0 is just x if it's used as a bool
          if (c->value.geti32() == 0) {
            return binary->left;
          }
          // TODO: Perhaps use it for separate final pass???
          // x != -1   ==>    x ^ -1
          // if (num->value.geti32() == -1) {
          //   binary->op = XorInt32;
          //   return binary;
          // }
        }
      } else if (binary->op == RemSInt32) {
        // bool(i32(x) % C_pot)  ==>  bool(x & (C_pot - 1))
        // bool(i32(x) % min_s)  ==>  bool(x & max_s)
        if (auto* c = binary->right->dynCast<Const>()) {
          if (c->value.isSignedMin() ||
              Bits::isPowerOf2(c->value.abs().geti32())) {
            binary->op = AndInt32;
            if (c->value.isSignedMin()) {
              c->value = Literal::makeSignedMax(Type::i32);
            } else {
              c->value = c->value.abs().sub(Literal::makeOne(Type::i32));
            }
            return binary;
          }
        }
      }
      if (auto* ext = Properties::getSignExtValue(binary)) {
        // use a cheaper zero-extent, we just care about the boolean value
        // anyhow
        return makeZeroExt(ext, Properties::getSignExtBits(binary));
      }
    } else if (auto* block = boolean->dynCast<Block>()) {
      if (block->type == Type::i32 && block->list.size() > 0) {
        block->list.back() = optimizeBoolean(block->list.back());
      }
    } else if (auto* iff = boolean->dynCast<If>()) {
      if (iff->type == Type::i32) {
        iff->ifTrue = optimizeBoolean(iff->ifTrue);
        iff->ifFalse = optimizeBoolean(iff->ifFalse);
      }
    } else if (auto* select = boolean->dynCast<Select>()) {
      select->ifTrue = optimizeBoolean(select->ifTrue);
      select->ifFalse = optimizeBoolean(select->ifFalse);
    } else if (auto* tryy = boolean->dynCast<Try>()) {
      if (tryy->type == Type::i32) {
        tryy->body = optimizeBoolean(tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = optimizeBoolean(tryy->catchBodies[i]);
        }
      }
    }
    // TODO: recurse into br values?
    return boolean;
  }